

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O1

DOMDocumentFragment * __thiscall
xercesc_4_0::DOMRangeImpl::traverseCommonEndContainer
          (DOMRangeImpl *this,DOMNode *startAncestor,int how)

{
  int iVar1;
  DOMRangeImpl *pDVar2;
  DOMNode *pDVar3;
  XMLSize_t XVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMRangeImpl *pDVar5;
  DOMRangeImpl *this_00;
  int iVar6;
  undefined4 extraout_var;
  
  if (how == 3) {
    pDVar2 = (DOMRangeImpl *)0x0;
  }
  else {
    iVar6 = (*(this->fDocument->super_DOMDocumentRange)._vptr_DOMDocumentRange[4])();
    pDVar2 = (DOMRangeImpl *)CONCAT44(extraout_var,iVar6);
  }
  pDVar5 = this;
  pDVar3 = traverseLeftBoundary(this,startAncestor,how);
  if (pDVar2 != (DOMRangeImpl *)0x0) {
    pDVar5 = pDVar2;
    (*((DOMNode *)&pDVar2->super_DOMRange)->_vptr_DOMNode[0x11])(pDVar2,pDVar3);
  }
  XVar4 = indexOf(pDVar5,startAncestor,this->fEndContainer);
  iVar6 = (int)this->fEndOffset;
  iVar1 = (*startAncestor->_vptr_DOMNode[10])(startAncestor);
  if (0 < (int)(~(uint)XVar4 + iVar6)) {
    iVar6 = iVar6 - (uint)XVar4;
    pDVar5 = (DOMRangeImpl *)CONCAT44(extraout_var_00,iVar1);
    do {
      this_00 = pDVar5;
      iVar1 = (*(pDVar5->super_DOMRange)._vptr_DOMRange[10])();
      pDVar3 = traverseFullySelected(this_00,(DOMNode *)pDVar5,how);
      if (pDVar2 != (DOMRangeImpl *)0x0) {
        (*((DOMNode *)&pDVar2->super_DOMRange)->_vptr_DOMNode[0x11])(pDVar2,pDVar3);
      }
      iVar6 = iVar6 + -1;
      pDVar5 = (DOMRangeImpl *)CONCAT44(extraout_var_01,iVar1);
    } while (1 < iVar6);
  }
  if (how != 2) {
    (*(this->super_DOMRange)._vptr_DOMRange[0xb])(this,startAncestor);
    (*(this->super_DOMRange)._vptr_DOMRange[0xe])(this,1);
  }
  return (DOMDocumentFragment *)pDVar2;
}

Assistant:

DOMDocumentFragment* DOMRangeImpl::traverseCommonEndContainer( DOMNode*startAncestor, int how )
{
    DOMDocumentFragment* frag = 0;
    if ( how!=DELETE_CONTENTS)
        frag = fDocument->createDocumentFragment();
    DOMNode* n = traverseLeftBoundary( startAncestor, how );
    if ( frag!=0 )
        frag->appendChild( n );
    XMLSize_t startIdx = indexOf( startAncestor, fEndContainer );
    ++startIdx;  // Because we already traversed it....

    int cnt = (int)fEndOffset - (int)startIdx;
    n = startAncestor->getNextSibling();
    while( cnt > 0 )
    {
        DOMNode* sibling = n->getNextSibling();
        DOMNode* xferNode = traverseFullySelected( n, how );
        if ( frag!=0 )
            frag->appendChild( xferNode );
        --cnt;
        n = sibling;
    }

    if ( how != CLONE_CONTENTS )
    {
        setStartAfter( startAncestor );
        collapse( true );
    }

    return frag;
}